

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Segment::DoLoadCluster(Segment *this,longlong *pos,long *len)

{
  bool bVar1;
  int iVar2;
  longlong lVar3;
  longlong lVar4;
  Segment *pSVar5;
  Segment *pSegment;
  IMkvReader *pIVar6;
  long lVar7;
  Cluster *pCVar8;
  long *in_RDX;
  long *in_RSI;
  Segment *in_RDI;
  Cluster *pCluster;
  longlong element_size_1;
  longlong off;
  Cluster *pCluster_1;
  long idx;
  long len_;
  longlong pos_;
  longlong element_size;
  longlong unknown_size;
  longlong size;
  longlong id;
  longlong idpos;
  longlong result;
  longlong cluster_size;
  longlong cluster_off;
  longlong segment_stop;
  long status;
  longlong avail;
  longlong total;
  Cues *in_stack_ffffffffffffff08;
  Cues *in_stack_ffffffffffffff10;
  long *in_stack_ffffffffffffff18;
  IMkvReader *pIVar9;
  Segment *in_stack_ffffffffffffff28;
  Cluster *in_stack_ffffffffffffff30;
  IMkvReader *in_stack_ffffffffffffff38;
  Cluster *in_stack_ffffffffffffff40;
  long local_b0;
  long local_a8;
  Cluster *in_stack_ffffffffffffff60;
  Segment *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  Cues *in_stack_ffffffffffffff78;
  long in_stack_ffffffffffffff80;
  Segment *local_50;
  long local_30;
  long local_28;
  long *local_20;
  long *local_18;
  long local_8;
  
  if (in_RDI->m_pos < 0) {
    local_8 = DoLoadClusterUnknownSize
                        (in_stack_ffffffffffffff28,(longlong *)in_RDI,in_stack_ffffffffffffff18);
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    iVar2 = (*in_RDI->m_pReader->_vptr_IMkvReader[1])(in_RDI->m_pReader,&local_28,&local_30);
    local_8 = (long)iVar2;
    if (-1 < local_8) {
      if ((local_28 < 0) || (local_30 <= local_28)) {
        if (in_RDI->m_size < 0) {
          pIVar9 = (IMkvReader *)0xffffffffffffffff;
        }
        else {
          pIVar9 = (IMkvReader *)(in_RDI->m_start + in_RDI->m_size);
        }
        local_50 = (Segment *)0xffffffffffffffff;
        pIVar6 = pIVar9;
        while( true ) {
          while( true ) {
            while( true ) {
              if ((-1 < local_28) && (local_28 <= in_RDI->m_pos)) {
                return 1;
              }
              if ((-1 < (long)pIVar9) && ((long)pIVar9 <= in_RDI->m_pos)) {
                return 1;
              }
              *local_18 = in_RDI->m_pos;
              if (local_30 < *local_18 + 1) {
                *local_20 = 1;
                return -3;
              }
              lVar3 = GetUIntLength(pIVar6,(longlong)in_stack_ffffffffffffff10,
                                    (long *)in_stack_ffffffffffffff08);
              if (lVar3 < 0) {
                return lVar3;
              }
              if (0 < lVar3) {
                return -3;
              }
              if ((-1 < (long)pIVar9) && ((long)pIVar9 < *local_18 + *local_20)) {
                return -2;
              }
              if (local_30 < *local_18 + *local_20) {
                return -3;
              }
              lVar7 = *local_18;
              lVar3 = ReadID(in_stack_ffffffffffffff38,(longlong)in_stack_ffffffffffffff30,
                             (long *)in_stack_ffffffffffffff28);
              if (lVar3 < 0) {
                return -2;
              }
              *local_18 = *local_20 + *local_18;
              if (local_30 < *local_18 + 1) {
                *local_20 = 1;
                return -3;
              }
              lVar4 = GetUIntLength(pIVar6,(longlong)in_stack_ffffffffffffff10,
                                    (long *)in_stack_ffffffffffffff08);
              if (lVar4 < 0) {
                return lVar4;
              }
              if (0 < lVar4) {
                return -3;
              }
              if ((-1 < (long)pIVar9) && ((long)pIVar9 < *local_18 + *local_20)) {
                return -2;
              }
              if (local_30 < *local_18 + *local_20) {
                return -3;
              }
              pSVar5 = (Segment *)
                       ReadUInt((IMkvReader *)in_stack_ffffffffffffff28,(longlong)in_RDI,
                                (long *)pIVar6);
              if ((long)pSVar5 < 0) {
                return (long)pSVar5;
              }
              *local_18 = *local_20 + *local_18;
              if (pSVar5 != (Segment *)0x0) break;
              in_RDI->m_pos = *local_18;
            }
            pSegment = (Segment *)((1L << ((char)*local_20 * '\a' & 0x3fU)) + -1);
            if (((-1 < (long)pIVar9) && (pSVar5 != pSegment)) &&
               ((long)pIVar9 < (long)&pSVar5->m_pReader + *local_18)) {
              return -2;
            }
            if (lVar3 != 0x1c53bb6b) break;
            if (pSVar5 == pSegment) {
              return -2;
            }
            if (in_RDI->m_pCues == (Cues *)0x0) {
              in_stack_ffffffffffffff80 = (*local_18 - lVar7) + (long)pSVar5;
              in_stack_ffffffffffffff08 = (Cues *)operator_new(0x48,(nothrow_t *)&std::nothrow);
              in_stack_ffffffffffffff77 = 0;
              in_stack_ffffffffffffff10 = (Cues *)0x0;
              if (in_stack_ffffffffffffff08 != (Cues *)0x0) {
                in_stack_ffffffffffffff77 = 1;
                in_stack_ffffffffffffff78 = in_stack_ffffffffffffff08;
                Cues::Cues(in_stack_ffffffffffffff08,in_RDI,*local_18,(longlong)pSVar5,lVar7,
                           in_stack_ffffffffffffff80);
                in_stack_ffffffffffffff10 = in_stack_ffffffffffffff08;
              }
              in_RDI->m_pCues = in_stack_ffffffffffffff10;
              if (in_RDI->m_pCues == (Cues *)0x0) {
                return -1;
              }
            }
            in_RDI->m_pos = (long)&pSVar5->m_pReader + *local_18;
          }
          if (lVar3 == 0x1f43b675) {
            pIVar6 = (IMkvReader *)(lVar7 - in_RDI->m_start);
            if (pSVar5 != pSegment) {
              local_50 = pSVar5;
            }
            if ((long)pIVar6 < 0) {
              return -2;
            }
            lVar7 = Cluster::HasBlockEntries
                              (pSegment,in_stack_ffffffffffffff80,
                               (longlong *)in_stack_ffffffffffffff78,
                               (long *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)
                              );
            if (lVar7 < 0) {
              *local_18 = local_a8;
              *local_20 = local_b0;
              return lVar7;
            }
            pSVar5 = (Segment *)in_RDI->m_clusterCount;
            if (0 < in_RDI->m_clusterPreloadCount) {
              if (in_RDI->m_clusterSize <= (long)pSVar5) {
                return -2;
              }
              in_stack_ffffffffffffff40 = in_RDI->m_clusters[(long)pSVar5];
              if ((in_stack_ffffffffffffff40 == (Cluster *)0x0) ||
                 (-1 < in_stack_ffffffffffffff40->m_index)) {
                return -2;
              }
              in_stack_ffffffffffffff38 =
                   (IMkvReader *)Cluster::GetPosition(in_stack_ffffffffffffff40);
              if ((long)in_stack_ffffffffffffff38 < 0) {
                return -2;
              }
              if (in_stack_ffffffffffffff38 == pIVar6) {
                if (lVar7 == 0) {
                  return -2;
                }
                if ((long)local_50 < 0) {
                  lVar3 = Cluster::GetElementSize(in_stack_ffffffffffffff40);
                  if (lVar3 < 1) {
                    return -2;
                  }
                  *local_18 = in_stack_ffffffffffffff40->m_element_start + lVar3;
                }
                else {
                  *local_18 = (long)&local_50->m_pReader + *local_18;
                }
                in_stack_ffffffffffffff40->m_index = (long)pSVar5;
                in_RDI->m_clusterCount = in_RDI->m_clusterCount + 1;
                in_RDI->m_clusterPreloadCount = in_RDI->m_clusterPreloadCount + -1;
                in_RDI->m_pos = *local_18;
                if ((-1 < (long)pIVar9) && ((long)pIVar9 < in_RDI->m_pos)) {
                  return -2;
                }
                return 0;
              }
            }
            if (lVar7 == 0) {
              if (-1 < (long)local_50) {
                *local_18 = (long)&local_50->m_pReader + *local_18;
              }
              if ((-1 < local_28) && (local_28 <= *local_18)) {
                in_RDI->m_pos = local_28;
                return 1;
              }
              if ((-1 < (long)pIVar9) && ((long)pIVar9 <= *local_18)) {
                in_RDI->m_pos = (longlong)pIVar9;
                return 1;
              }
              in_RDI->m_pos = *local_18;
              return 2;
            }
            pCVar8 = Cluster::Create(pSVar5,(long)in_stack_ffffffffffffff40,
                                     (longlong)in_stack_ffffffffffffff38);
            if (pCVar8 == (Cluster *)0x0) {
              return -1;
            }
            bVar1 = AppendCluster(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
            if (!bVar1) {
              if (pCVar8 != (Cluster *)0x0) {
                Cluster::~Cluster(in_stack_ffffffffffffff30);
                operator_delete(pCVar8);
              }
              return -1;
            }
            if ((long)local_50 < 0) {
              in_RDI->m_pUnknownSize = pCVar8;
              in_RDI->m_pos = -*local_18;
              return 0;
            }
            *local_18 = (long)&local_50->m_pReader + *local_18;
            in_RDI->m_pos = *local_18;
            if ((0 < (long)pIVar9) && ((long)pIVar9 < in_RDI->m_pos)) {
              return -2;
            }
            return 0;
          }
          if (pSVar5 == pSegment) break;
          in_RDI->m_pos = (long)&pSVar5->m_pReader + *local_18;
        }
        local_8 = -2;
      }
      else {
        local_8 = -2;
      }
    }
  }
  return local_8;
}

Assistant:

long Segment::DoLoadCluster(long long& pos, long& len) {
  if (m_pos < 0)
    return DoLoadClusterUnknownSize(pos, len);

  long long total, avail;

  long status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  if (total >= 0 && avail > total)
    return E_FILE_FORMAT_INVALID;

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  long long cluster_off = -1;  // offset relative to start of segment
  long long cluster_size = -1;  // size of cluster payload

  for (;;) {
    if ((total >= 0) && (m_pos >= total))
      return 1;  // no more clusters

    if ((segment_stop >= 0) && (m_pos >= segment_stop))
      return 1;  // no more clusters

    pos = m_pos;

    // Read ID

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long idpos = pos;
    const long long id = ReadID(m_pReader, idpos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID

    // Read Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume length of size of element

    // pos now points to start of payload

    if (size == 0) {
      // Missing element payload: move on.
      m_pos = pos;
      continue;
    }

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if ((segment_stop >= 0) && (size != unknown_size) &&
        ((pos + size) > segment_stop)) {
      return E_FILE_FORMAT_INVALID;
    }

    if (id == libwebm::kMkvCues) {
      if (size == unknown_size) {
        // Cues element of unknown size: Not supported.
        return E_FILE_FORMAT_INVALID;
      }

      if (m_pCues == NULL) {
        const long long element_size = (pos - idpos) + size;

        m_pCues = new (std::nothrow) Cues(this, pos, size, idpos, element_size);
        if (m_pCues == NULL)
          return -1;
      }

      m_pos = pos + size;  // consume payload
      continue;
    }

    if (id != libwebm::kMkvCluster) {
      // Besides the Segment, Libwebm allows only cluster elements of unknown
      // size. Fail the parse upon encountering a non-cluster element reporting
      // unknown size.
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      m_pos = pos + size;  // consume payload
      continue;
    }

    // We have a cluster.

    cluster_off = idpos - m_start;  // relative pos

    if (size != unknown_size)
      cluster_size = size;

    break;
  }

  if (cluster_off < 0) {
    // No cluster, die.
    return E_FILE_FORMAT_INVALID;
  }

  long long pos_;
  long len_;

  status = Cluster::HasBlockEntries(this, cluster_off, pos_, len_);

  if (status < 0) {  // error, or underflow
    pos = pos_;
    len = len_;

    return status;
  }

  // status == 0 means "no block entries found"
  // status > 0 means "found at least one block entry"

  // TODO:
  // The issue here is that the segment increments its own
  // pos ptr past the most recent cluster parsed, and then
  // starts from there to parse the next cluster.  If we
  // don't know the size of the current cluster, then we
  // must either parse its payload (as we do below), looking
  // for the cluster (or cues) ID to terminate the parse.
  // This isn't really what we want: rather, we really need
  // a way to create the curr cluster object immediately.
  // The pity is that cluster::parse can determine its own
  // boundary, and we largely duplicate that same logic here.
  //
  // Maybe we need to get rid of our look-ahead preloading
  // in source::parse???
  //
  // As we're parsing the blocks in the curr cluster
  //(in cluster::parse), we should have some way to signal
  // to the segment that we have determined the boundary,
  // so it can adjust its own segment::m_pos member.
  //
  // The problem is that we're asserting in asyncreadinit,
  // because we adjust the pos down to the curr seek pos,
  // and the resulting adjusted len is > 2GB.  I'm suspicious
  // that this is even correct, but even if it is, we can't
  // be loading that much data in the cache anyway.

  const long idx = m_clusterCount;

  if (m_clusterPreloadCount > 0) {
    if (idx >= m_clusterSize)
      return E_FILE_FORMAT_INVALID;

    Cluster* const pCluster = m_clusters[idx];
    if (pCluster == NULL || pCluster->m_index >= 0)
      return E_FILE_FORMAT_INVALID;

    const long long off = pCluster->GetPosition();
    if (off < 0)
      return E_FILE_FORMAT_INVALID;

    if (off == cluster_off) {  // preloaded already
      if (status == 0)  // no entries found
        return E_FILE_FORMAT_INVALID;

      if (cluster_size >= 0)
        pos += cluster_size;
      else {
        const long long element_size = pCluster->GetElementSize();

        if (element_size <= 0)
          return E_FILE_FORMAT_INVALID;  // TODO: handle this case

        pos = pCluster->m_element_start + element_size;
      }

      pCluster->m_index = idx;  // move from preloaded to loaded
      ++m_clusterCount;
      --m_clusterPreloadCount;

      m_pos = pos;  // consume payload
      if (segment_stop >= 0 && m_pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      return 0;  // success
    }
  }

  if (status == 0) {  // no entries found
    if (cluster_size >= 0)
      pos += cluster_size;

    if ((total >= 0) && (pos >= total)) {
      m_pos = total;
      return 1;  // no more clusters
    }

    if ((segment_stop >= 0) && (pos >= segment_stop)) {
      m_pos = segment_stop;
      return 1;  // no more clusters
    }

    m_pos = pos;
    return 2;  // try again
  }

  // status > 0 means we have an entry

  Cluster* const pCluster = Cluster::Create(this, idx, cluster_off);
  if (pCluster == NULL)
    return -1;

  if (!AppendCluster(pCluster)) {
    delete pCluster;
    return -1;
  }

  if (cluster_size >= 0) {
    pos += cluster_size;

    m_pos = pos;

    if (segment_stop > 0 && m_pos > segment_stop)
      return E_FILE_FORMAT_INVALID;

    return 0;
  }

  m_pUnknownSize = pCluster;
  m_pos = -pos;

  return 0;  // partial success, since we have a new cluster

  // status == 0 means "no block entries found"
  // pos designates start of payload
  // m_pos has NOT been adjusted yet (in case we need to come back here)
}